

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void event_go_to_roll_call(tgestate_t *state)

{
  tgestate_t *in_RDI;
  
  in_RDI->bell = '(';
  queue_message(in_RDI,message_ROLL_CALL);
  go_to_roll_call((tgestate_t *)0x115d27);
  return;
}

Assistant:

static void event_go_to_roll_call(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_ROLL_CALL);
  go_to_roll_call(state);
}